

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O1

void __thiscall
mxx::custom_op<long,true>::custom_op<MxxReduce_GlobalReduce_Test::TestBody()::__0>
          (custom_op<long,true> *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined8 *puVar5;
  _func_void__Any_data_ptr_void_ptr_ptr_void_ptr_ptr_int_ptr_ptr *__tmp_2;
  _func_bool__Any_data_ptr__Any_data_ptr__Manager_operation *__tmp_1;
  datatype dt;
  _Any_data __tmp;
  undefined1 local_48 [16];
  undefined8 local_38;
  undefined8 uStack_30;
  int local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  
  *(undefined ***)this = &PTR__custom_op_00162e78;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 0x20) = 0;
  this[0x28] = (custom_op<long,true>)0x0;
  local_38._0_1_ = false;
  local_38._1_7_ = 0;
  uStack_30 = 0;
  local_48._0_8_ = (_func_int **)0x0;
  local_48._8_8_ = (MPI_Datatype)0x0;
  puVar5 = (undefined8 *)operator_new(0x10);
  *puVar5 = custom_function<MxxReduce_GlobalReduce_Test::TestBody()::__0>;
  local_48._0_4_ = SUB84(puVar5,0);
  uVar1 = local_48._0_4_;
  local_48._4_4_ = (undefined4)((ulong)puVar5 >> 0x20);
  uVar2 = local_48._4_4_;
  uVar3 = local_48._8_4_;
  uVar4 = local_48._12_4_;
  local_28 = local_48._0_4_;
  uStack_24 = local_48._4_4_;
  uStack_20 = local_48._8_4_;
  uStack_1c = local_48._12_4_;
  local_48._0_8_ = (_func_int **)0x0;
  local_48._8_8_ = (MPI_Datatype)0x0;
  *(undefined4 *)
   &(((function<void_(void_*,_void_*,_int_*)> *)(this + 8))->super__Function_base)._M_functor =
       uVar1;
  *(undefined4 *)(this + 0xc) = uVar2;
  *(undefined4 *)(this + 0x10) = uVar3;
  *(undefined4 *)(this + 0x14) = uVar4;
  local_38 = *(code **)(this + 0x18);
  *(code **)(this + 0x18) =
       std::
       _Function_handler<void_(void_*,_void_*,_int_*),_std::_Bind<void_(*((lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_reductions.cpp:242:47),_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))((lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_reductions.cpp:242:47),_void_*,_void_*,_int_*)>_>
       ::_M_manager;
  uStack_30 = *(undefined8 *)(this + 0x20);
  *(code **)(this + 0x20) =
       std::
       _Function_handler<void_(void_*,_void_*,_int_*),_std::_Bind<void_(*((lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_reductions.cpp:242:47),_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))((lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_reductions.cpp:242:47),_void_*,_void_*,_int_*)>_>
       ::_M_invoke;
  if (local_38 != (code *)0x0) {
    (*local_38)(local_48,local_48,3);
  }
  local_48._0_8_ = &PTR__datatype_00162ce0;
  local_48._8_8_ = &ompi_mpi_long;
  local_38._0_1_ = true;
  MPI_Type_dup(&ompi_mpi_long,this + 0x30);
  local_28 = 0x543;
  attr_map<int,_std::function<void_(void_*,_void_*,_int_*)>_>::set
            ((MPI_Datatype *)(this + 0x30),&local_28,
             (function<void_(void_*,_void_*,_int_*)> *)(this + 8));
  MPI_Op_create(custom_op<long,_true>::mpi_user_function,1,this + 0x38);
  datatype::~datatype((datatype *)local_48);
  return;
}

Assistant:

custom_op(Func func) : m_builtin(false) {
        if (mxx::is_builtin_type<T>::value) {
            // check if the operator is MPI built-in (in case the type
            // is also a MPI built-in type)
            MPI_Op op = get_builtin_op<T, Func>::op(std::forward<Func>(func));
            if (op != MPI_OP_NULL) {
                // this op is builtin, save it as such and don't copy built-in type
                m_builtin = true;
                m_op = op;
                mxx::datatype dt = mxx::get_datatype<T>();
                m_type_copy = dt.type();
            }
        }
        if (!m_builtin) {
            // create user function
            using namespace std::placeholders;
            m_user_func = std::bind(custom_op::custom_function<Func>,
                                  std::forward<Func>(func), _1, _2, _3);
            // get datatype associated with the type `T`
            mxx::datatype dt = mxx::get_datatype<T>();
            // attach function to a copy of the datatype
            MPI_Type_dup(dt.type(), &m_type_copy);
            attr_map<int, func_t>::set(m_type_copy, 1347, m_user_func);
            // create op
            MPI_Op_create(&custom_op::mpi_user_function, IsCommutative, &m_op);
        }
    }